

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

int google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
              (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint value;
  undefined4 extraout_var;
  long lVar6;
  long *plVar7;
  long *plVar8;
  uint uVar9;
  uint64 uVar10;
  uint uVar11;
  string scratch;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar8 = (long *)CONCAT44(extraout_var,iVar2);
  if (*(int *)(field + 0x30) == 3) {
    uVar3 = (**(code **)(*plVar8 + 0x30))();
  }
  else {
    bVar1 = (**(code **)(*plVar8 + 0x28))(plVar8,message,field);
    uVar3 = (uint)bVar1;
  }
  uVar11 = 0;
  uVar9 = 0;
  switch(*(undefined4 *)(field + 0x2c)) {
  case 1:
  case 6:
  case 0x10:
    uVar9 = uVar3 << 3;
    break;
  case 2:
  case 7:
  case 0xf:
    uVar9 = uVar3 << 2;
    break;
  case 3:
    if (*(int *)(field + 0x30) != 3) {
      uVar10 = (**(code **)(*plVar8 + 0x70))(plVar8,message,field);
LAB_001bc33b:
      iVar2 = io::CodedOutputStream::VarintSize64(uVar10);
      return iVar2;
    }
    uVar9 = uVar11;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      uVar11 = 0;
      do {
        uVar10 = (**(code **)(*plVar8 + 0x120))(plVar8,message,field,uVar11);
        iVar2 = io::CodedOutputStream::VarintSize64(uVar10);
        uVar9 = uVar9 + iVar2;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    break;
  case 4:
    if (*(int *)(field + 0x30) != 3) {
      uVar10 = (**(code **)(*plVar8 + 0x80))(plVar8,message,field);
      goto LAB_001bc33b;
    }
    uVar9 = uVar11;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      uVar11 = 0;
      do {
        uVar10 = (**(code **)(*plVar8 + 0x130))(plVar8,message,field,uVar11);
        iVar2 = io::CodedOutputStream::VarintSize64(uVar10);
        uVar9 = uVar9 + iVar2;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    break;
  case 5:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar9 = 0;
      do {
        uVar5 = (**(code **)(*plVar8 + 0x118))(plVar8,message,field,uVar9);
        if ((int)uVar5 < 0) {
          iVar4 = 10;
        }
        else {
          iVar4 = 1;
          if (0x7f < uVar5) {
            iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
          }
        }
        iVar2 = iVar2 + iVar4;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
      return iVar2;
    }
    uVar3 = (**(code **)(*plVar8 + 0x68))(plVar8,message,field);
    goto joined_r0x001bc2cf;
  case 8:
    uVar9 = uVar3;
    break;
  case 9:
  case 0xc:
    uVar9 = uVar11;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      uVar11 = 0;
      do {
        local_48 = 0;
        local_40 = 0;
        local_50 = &local_40;
        if (*(int *)(field + 0x30) == 3) {
          lVar6 = (**(code **)(*plVar8 + 0x168))(plVar8,message,field,uVar11,&local_50);
        }
        else {
          lVar6 = (**(code **)(*plVar8 + 0xb8))(plVar8,message,field,&local_50);
        }
        iVar2 = 1;
        if (0x7f < *(uint *)(lVar6 + 8)) {
          iVar2 = io::CodedOutputStream::VarintSize32Fallback(*(uint *)(lVar6 + 8));
        }
        uVar9 = uVar9 + iVar2 + *(int *)(lVar6 + 8);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    break;
  case 10:
    if (*(int *)(field + 0x30) != 3) {
      plVar8 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8,message,field,0);
      iVar2 = (**(code **)(*plVar8 + 0x48))(plVar8);
      return iVar2;
    }
    uVar9 = uVar11;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      uVar11 = 0;
      do {
        plVar7 = (long *)(**(code **)(*plVar8 + 0x160))(plVar8,message,field,uVar11);
        iVar2 = (**(code **)(*plVar7 + 0x48))(plVar7);
        uVar9 = uVar9 + iVar2;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    break;
  case 0xb:
    if (*(int *)(field + 0x30) == 3) {
      uVar9 = uVar11;
      if (0 < (int)uVar3) {
        uVar9 = 0;
        uVar11 = 0;
        do {
          plVar7 = (long *)(**(code **)(*plVar8 + 0x160))(plVar8,message,field,uVar11);
          value = (**(code **)(*plVar7 + 0x48))(plVar7);
          iVar2 = 1;
          if (0x7f < value) {
            iVar2 = io::CodedOutputStream::VarintSize32Fallback(value);
          }
          uVar9 = uVar9 + value + iVar2;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
    }
    else {
      plVar8 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8,message,field,0);
      uVar3 = (**(code **)(*plVar8 + 0x48))(plVar8);
      iVar2 = 1;
      if (0x7f < uVar3) {
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar3);
      }
      uVar9 = iVar2 + uVar3;
    }
    break;
  case 0xd:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar9 = 0;
      do {
        uVar5 = (**(code **)(*plVar8 + 0x128))(plVar8,message,field,uVar9);
        iVar4 = 1;
        if (0x7f < uVar5) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        }
        iVar2 = iVar2 + iVar4;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
      return iVar2;
    }
    uVar3 = (**(code **)(*plVar8 + 0x78))(plVar8,message,field);
    goto joined_r0x001bc2e0;
  case 0xe:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar9 = 0;
      do {
        lVar6 = (**(code **)(*plVar8 + 0x158))(plVar8,message,field,uVar9);
        uVar11 = *(uint *)(lVar6 + 0x10);
        if ((int)uVar11 < 0) {
          iVar4 = 10;
        }
        else {
          iVar4 = 1;
          if (0x7f < uVar11) {
            iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar11);
          }
        }
        iVar2 = iVar2 + iVar4;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
      return iVar2;
    }
    lVar6 = (**(code **)(*plVar8 + 0xa8))(plVar8,message,field);
    uVar3 = *(uint *)(lVar6 + 0x10);
joined_r0x001bc2cf:
    if ((int)uVar3 < 0) {
      uVar9 = 10;
    }
    else {
joined_r0x001bc2e0:
      uVar9 = 1;
      if (0x7f < uVar3) {
LAB_001bc2e6:
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar3);
        return iVar2;
      }
    }
    break;
  case 0x11:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar9 = 0;
      do {
        iVar4 = (**(code **)(*plVar8 + 0x118))(plVar8,message,field,uVar9);
        uVar11 = iVar4 >> 0x1f ^ iVar4 * 2;
        iVar4 = 1;
        if (0x7f < uVar11) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar11);
        }
        iVar2 = iVar2 + iVar4;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
      return iVar2;
    }
    iVar2 = (**(code **)(*plVar8 + 0x68))(plVar8,message,field);
    uVar3 = iVar2 >> 0x1f ^ iVar2 * 2;
    if (uVar3 < 0x80) {
      return 1;
    }
    goto LAB_001bc2e6;
  case 0x12:
    if (*(int *)(field + 0x30) != 3) {
      lVar6 = (**(code **)(*plVar8 + 0x70))(plVar8,message,field);
      uVar10 = lVar6 * 2 ^ lVar6 >> 0x3f;
      goto LAB_001bc33b;
    }
    uVar9 = uVar11;
    if (0 < (int)uVar3) {
      uVar9 = 0;
      uVar11 = 0;
      do {
        lVar6 = (**(code **)(*plVar8 + 0x120))(plVar8,message,field,uVar11);
        iVar2 = io::CodedOutputStream::VarintSize64(lVar6 * 2 ^ lVar6 >> 0x3f);
        uVar9 = uVar9 + iVar2;
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
  }
  return uVar9;
}

Assistant:

int WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int count = 0;
  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  int data_size = 0;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}